

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int quicly_get_stats(quicly_conn_t *conn,quicly_stats_t *stats)

{
  void *in_RSI;
  long in_RDI;
  
  memcpy(in_RSI,(void *)(in_RDI + 0x340),0x1d0);
  *(undefined8 *)((long)in_RSI + 0x1d0) = *(undefined8 *)(in_RDI + 0x620);
  *(undefined8 *)((long)in_RSI + 0x1d8) = *(undefined8 *)(in_RDI + 0x628);
  memcpy((void *)((long)in_RSI + 0x1e0),(void *)(in_RDI + 0x738),0x50);
  return 0;
}

Assistant:

int quicly_get_stats(quicly_conn_t *conn, quicly_stats_t *stats)
{
    /* copy the pre-built stats fields */
    memcpy(stats, &conn->super.stats, sizeof(conn->super.stats));

    /* set or generate the non-pre-built stats fields here */
    stats->rtt = conn->egress.loss.rtt;
    stats->cc = conn->egress.cc;
    return 0;
}